

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printf.hpp
# Opt level: O0

void __thiscall
fmt::impl::counting_ostream<char,_std::char_traits<char>_>::counting_ostream
          (counting_ostream<char,_std::char_traits<char>_> *this,
          basic_ostream<char,_std::char_traits<char>_> *out)

{
  basic_streambuf<char,_std::char_traits<char>_> *sbuf;
  locale local_38;
  locale local_30 [3];
  basic_ostream<char,_std::char_traits<char>_> *local_18;
  basic_ostream<char,_std::char_traits<char>_> *out_local;
  counting_ostream<char,_std::char_traits<char>_> *this_local;
  
  local_18 = out;
  out_local = &this->super_basic_ostream<char,_std::char_traits<char>_>;
  std::ios::ios((ios *)&(this->super_basic_ostream<char,_std::char_traits<char>_>).field_0x58);
  (this->super_basic_ostream<char,_std::char_traits<char>_>)._vptr_basic_ostream =
       (_func_int **)&PTR__counting_ostream_002c72c8;
  *(undefined ***)&(this->super_basic_ostream<char,_std::char_traits<char>_>).field_0x58 =
       &PTR__counting_ostream_002c72f0;
  std::ostream::ostream(this,(streambuf *)&PTR_construction_vtable_24__002c7308);
  (this->super_basic_ostream<char,_std::char_traits<char>_>)._vptr_basic_ostream =
       (_func_int **)&PTR__counting_ostream_002c72c8;
  *(undefined ***)&(this->super_basic_ostream<char,_std::char_traits<char>_>).field_0x58 =
       &PTR__counting_ostream_002c72f0;
  sbuf = (basic_streambuf<char,_std::char_traits<char>_> *)std::ios::rdbuf();
  counting_ostreambuf<char,_std::char_traits<char>_>::counting_ostreambuf
            ((counting_ostreambuf<char,_std::char_traits<char>_> *)
             &(this->super_basic_ostream<char,_std::char_traits<char>_>).field_0x8,sbuf);
  std::ios_base::getloc((ios_base *)&local_38);
  std::ios::imbue(local_30);
  std::locale::~locale(local_30);
  std::locale::~locale(&local_38);
  return;
}

Assistant:

counting_ostream(std::basic_ostream<CharT, Traits>& out) :
	    Base(&sbuf), sbuf(*(out.rdbuf())) {
	 /* inherit locale from our base stream */
	 this->imbue(out.getloc());
      }